

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

void __thiscall hdc::Class::addMethod(Class *this,Def *def)

{
  int iVar1;
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  Def *local_18;
  Def *def_local;
  Class *this_local;
  
  local_18 = def;
  def_local = (Def *)this;
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::push_back(&this->methods,&local_18);
  Def::setClass(local_18,this);
  Def::setFile(local_18,this->file);
  iVar1 = this->methodCounter;
  this->methodCounter = iVar1 + 1;
  Def::setId(local_18,iVar1);
  Def::getName_abi_cxx11_((Def *)local_38);
  iVar1 = std::__cxx11::string::compare(local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (iVar1 == 0) {
    std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::push_back(&this->constructors,&local_18);
  }
  else {
    Def::getName_abi_cxx11_((Def *)local_58);
    iVar1 = std::__cxx11::string::compare(local_58);
    std::__cxx11::string::~string((string *)local_58);
    if (iVar1 == 0) {
      this->destructor = local_18;
    }
  }
  return;
}

Assistant:

void Class::addMethod(Def* def) {
    methods.push_back(def);
    def->setClass(this);
    def->setFile(this->file);
    def->setId(methodCounter++);
    //def->setGlobalID(0);

    if (def->getName().compare("init") == 0) {
        constructors.push_back(def);
    } else if (def->getName().compare("destroy") == 0) {
        destructor = def;
    }
}